

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

HelicsQuery helicsCreateQuery(char *target,char *query)

{
  void *pvVar1;
  long in_RSI;
  QueryObject *in_RDI;
  QueryObject *queryObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  QueryObject *in_stack_ffffffffffffff60;
  bool local_72;
  allocator<char> local_71;
  allocator<char> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  bool local_3a;
  allocator<char> local_39 [33];
  void *local_18;
  long local_10;
  QueryObject *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  pvVar1 = operator_new(0x80);
  helics::QueryObject::QueryObject(in_stack_ffffffffffffff60);
  local_18 = pvVar1;
  if (local_10 == 0) {
    std::__cxx11::string::string(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90
              );
  }
  local_3a = local_10 != 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&in_stack_ffffffffffffff60->target,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(&in_stack_ffffffffffffff60->target);
  if (local_3a) {
    std::allocator<char>::~allocator(local_39);
  }
  local_72 = local_8 == (QueryObject *)0x0;
  if (local_72) {
    std::__cxx11::string::string(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90
              );
    in_stack_ffffffffffffff60 = local_8;
  }
  local_72 = !local_72;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&in_stack_ffffffffffffff60->target,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(&in_stack_ffffffffffffff60->target);
  if (local_72) {
    std::allocator<char>::~allocator(&local_71);
  }
  *(undefined4 *)((long)local_18 + 0x7c) = 0x27063885;
  return local_18;
}

Assistant:

HelicsQuery helicsCreateQuery(const char* target, const char* query)
{
    auto* queryObj = new helics::QueryObject;
    queryObj->query = AS_STRING(query);
    queryObj->target = AS_STRING(target);
    queryObj->valid = validQueryIdentifier;
    return reinterpret_cast<void*>(queryObj);
}